

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dr_wav.h
# Opt level: O3

drwav_bool32 drwav__seek_from_start(drwav_seek_proc onSeek,drwav_uint64 offset,void *pUserData)

{
  drwav_bool32 dVar1;
  drwav_seek_origin dVar2;
  
  dVar2 = drwav_seek_origin_start;
  if (offset >> 0x1f != 0) {
    dVar1 = (*onSeek)(pUserData,0x7fffffff,drwav_seek_origin_start);
    if (dVar1 != 0) {
      offset = offset - 0x7fffffff;
      dVar2 = drwav_seek_origin_current;
      do {
        if (offset < 0x80000000) goto LAB_001223f6;
        dVar1 = (*onSeek)(pUserData,0x7fffffff,drwav_seek_origin_current);
        offset = offset - 0x7fffffff;
      } while (dVar1 != 0);
    }
    return 0;
  }
LAB_001223f6:
  dVar1 = (*onSeek)(pUserData,(int)offset,dVar2);
  return dVar1;
}

Assistant:

static drwav_bool32 drwav__seek_from_start(drwav_seek_proc onSeek, drwav_uint64 offset, void* pUserData)
{
    if (offset <= 0x7FFFFFFF) {
        return onSeek(pUserData, (int)offset, drwav_seek_origin_start);
    }

    /* Larger than 32-bit seek. */
    if (!onSeek(pUserData, 0x7FFFFFFF, drwav_seek_origin_start)) {
        return DRWAV_FALSE;
    }
    offset -= 0x7FFFFFFF;

    for (;;) {
        if (offset <= 0x7FFFFFFF) {
            return onSeek(pUserData, (int)offset, drwav_seek_origin_current);
        }

        if (!onSeek(pUserData, 0x7FFFFFFF, drwav_seek_origin_current)) {
            return DRWAV_FALSE;
        }
        offset -= 0x7FFFFFFF;
    }

    /* Should never get here. */
    /*return DRWAV_TRUE; */
}